

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O2

idx_t duckdb::GetConsecutiveChildList(Vector *list,Vector *result,idx_t offset,idx_t count)

{
  data_ptr_t pdVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  idx_t row_idx;
  long lVar5;
  long lVar6;
  idx_t c;
  ulong uVar7;
  long *plVar8;
  idx_t count_00;
  SelectionVector sel;
  SelectionVector local_48;
  
  FlatVector::VerifyFlatVector(list);
  pdVar1 = list->data;
  uVar7 = count + offset;
  plVar8 = (long *)(pdVar1 + offset * 0x10 + 8);
  bVar4 = true;
  count_00 = 0;
  for (row_idx = offset; row_idx < uVar7; row_idx = row_idx + 1) {
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar3) {
      bVar4 = (bool)(bVar4 & plVar8[-1] == count_00);
      count_00 = count_00 + *plVar8;
    }
    plVar8 = plVar8 + 2;
  }
  if (!bVar4) {
    SelectionVector::SelectionVector(&local_48,count_00);
    lVar5 = 0;
    for (; offset < uVar7; offset = offset + 1) {
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(list->validity).super_TemplatedValidityMask<unsigned_long>,offset);
      if (bVar4) {
        lVar2 = *(long *)(pdVar1 + offset * 0x10 + 8);
        for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
          local_48.sel_vector[lVar5 + lVar6] = *(int *)(pdVar1 + offset * 0x10) + (int)lVar6;
        }
        lVar5 = lVar5 + lVar6;
      }
    }
    Vector::Slice(result,&local_48,count_00);
    Vector::Flatten(result,count_00);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return count_00;
}

Assistant:

idx_t GetConsecutiveChildList(Vector &list, Vector &result, idx_t offset, idx_t count) {
	// returns a consecutive child list that fully flattens and repeats all required elements
	auto &validity = FlatVector::Validity(list);
	auto list_entries = FlatVector::GetData<list_entry_t>(list);
	bool is_consecutive = true;
	idx_t total_length = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		if (list_entries[c].offset != total_length) {
			is_consecutive = false;
		}
		total_length += list_entries[c].length;
	}
	if (is_consecutive) {
		// already consecutive - leave it as-is
		return total_length;
	}
	SelectionVector sel(total_length);
	idx_t index = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		for (idx_t k = 0; k < list_entries[c].length; k++) {
			sel.set_index(index++, list_entries[c].offset + k);
		}
	}
	result.Slice(sel, total_length);
	result.Flatten(total_length);
	return total_length;
}